

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall slang::driver::Driver::parseCommandLine(Driver *this,string_view argList)

{
  pointer pbVar1;
  string_view text;
  bool bVar2;
  byte bVar3;
  pointer pbVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  pointer pcVar5;
  char *pcVar6;
  string local_50;
  
  bVar2 = CommandLine::parse(&this->cmdLine,argList,(ParseOptions)0x0);
  if (bVar2) {
    bVar3 = this->anyFailedLoads ^ 1;
  }
  else {
    pbVar1 = (this->cmdLine).errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->cmdLine).errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      pcVar5 = (pbVar4->_M_dataplus)._M_p;
      pcVar6 = (char *)pbVar4->_M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&stack0xffffffffffffff98;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x3;
      ::fmt::v9::vformat_abi_cxx11_(&local_50,(v9 *)0x33e25a,fmt,args);
      text._M_str = pcVar6;
      text._M_len = (size_t)pcVar5;
      OS::printE(text);
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar3 = 0;
  }
  return (bool)bVar3;
}

Assistant:

[[nodiscard]] bool Driver::parseCommandLine(string_view argList) {
    if (!cmdLine.parse(argList)) {
        for (auto& err : cmdLine.getErrors())
            OS::printE(fmt::format("{}\n", err));
        return false;
    }
    return !anyFailedLoads;
}